

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O3

void __thiscall
Assimp::MD5::MD5CameraParser::MD5CameraParser(MD5CameraParser *this,SectionList *mSections)

{
  string *psVar1;
  iterator __position;
  pointer pEVar2;
  byte bVar3;
  int iVar4;
  Logger *pLVar5;
  ulong uVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  Element *elem_1;
  pointer pCVar10;
  pointer pEVar11;
  size_type sVar12;
  Element *elem;
  pointer pSVar13;
  byte *pbVar14;
  byte *pbVar15;
  CameraAnimFrameDesc local_68;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"MD5CameraParser begin");
  this->fFrameRate = 24.0;
  pSVar13 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  local_40 = (mSections->
             super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar13 != local_40) {
    do {
      psVar1 = &pSVar13->mName;
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      local_48 = pSVar13;
      if (iVar4 == 0) {
        pcVar7 = (pSVar13->mGlobalValue)._M_dataplus._M_p;
        cVar8 = *pcVar7;
        if ((byte)(cVar8 - 0x3aU) < 0xf6) {
          sVar12 = 0;
        }
        else {
          uVar9 = 0;
          do {
            pcVar7 = pcVar7 + 1;
            uVar9 = (uint)(byte)(cVar8 - 0x30) + uVar9 * 10;
            cVar8 = *pcVar7;
          } while (0xf5 < (byte)(cVar8 - 0x3aU));
          sVar12 = (size_type)uVar9;
        }
        std::
        vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
        ::reserve(&this->frames,sVar12);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar4 == 0) {
          local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ =
               local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
          fast_atoreal_move<float>((pSVar13->mGlobalValue)._M_dataplus._M_p,(float *)&local_68,true)
          ;
          this->fFrameRate = local_68.super_BaseFrameDesc.vPositionXYZ.x;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar4 == 0) {
            pcVar7 = (pSVar13->mGlobalValue)._M_dataplus._M_p;
            cVar8 = *pcVar7;
            if ((byte)(cVar8 - 0x3aU) < 0xf6) {
              sVar12 = 0;
            }
            else {
              uVar9 = 0;
              do {
                pcVar7 = pcVar7 + 1;
                uVar9 = (uint)(byte)(cVar8 - 0x30) + uVar9 * 10;
                cVar8 = *pcVar7;
              } while (0xf5 < (byte)(cVar8 - 0x3aU));
              sVar12 = (size_type)uVar9;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->cuts,sVar12);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar4 == 0) {
              pEVar2 = (pSVar13->mElements).
                       super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pEVar11 = (pSVar13->mElements).
                             super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                             ._M_impl.super__Vector_impl_data._M_start; pEVar11 != pEVar2;
                  pEVar11 = pEVar11 + 1) {
                pcVar7 = pEVar11->szStart;
                cVar8 = *pcVar7;
                iVar4 = 1;
                if (0xf5 < (byte)(cVar8 - 0x3aU)) {
                  iVar4 = 0;
                  do {
                    pcVar7 = pcVar7 + 1;
                    iVar4 = (uint)(byte)(cVar8 - 0x30) + iVar4 * 10;
                    cVar8 = *pcVar7;
                  } while (0xf5 < (byte)(cVar8 - 0x3aU));
                  iVar4 = iVar4 + 1;
                }
                local_68.super_BaseFrameDesc.vPositionXYZ.x = (float)iVar4;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&this->cuts,(uint *)&local_68);
              }
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar4 == 0) {
                pEVar11 = (local_48->mElements).
                          super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_38 = (local_48->mElements).
                           super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                if (pEVar11 != local_38) {
                  do {
                    pbVar14 = (byte *)pEVar11->szStart;
                    local_68.super_BaseFrameDesc.vRotationQuat.y = 0.0;
                    local_68.super_BaseFrameDesc.vRotationQuat.z = 0.0;
                    local_68.fFOV = 0.0;
                    local_68.super_BaseFrameDesc.vPositionXYZ.x = 0.0;
                    local_68.super_BaseFrameDesc.vPositionXYZ.y = 0.0;
                    local_68.super_BaseFrameDesc.vPositionXYZ.z = 0.0;
                    local_68.super_BaseFrameDesc.vRotationQuat.x = 0.0;
                    __position._M_current =
                         (this->frames).
                         super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (this->frames).
                        super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ::_M_realloc_insert<Assimp::MD5::CameraAnimFrameDesc>
                                (&this->frames,__position,&local_68);
                      pCVar10 = (this->frames).
                                super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    else {
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vRotationQuat.z
                           = 0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.z
                           = 0;
                      pCVar10 = (this->frames).
                                super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1;
                      (this->frames).
                      super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish = pCVar10;
                    }
                    pbVar15 = pbVar14;
                    while( true ) {
                      pbVar15 = pbVar15 + 1;
                      bVar3 = *pbVar14;
                      uVar6 = (ulong)bVar3;
                      if (0x20 < uVar6) break;
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                          bVar3 = *pbVar14;
                        }
                        break;
                      }
                      pbVar14 = pbVar14 + 1;
                    }
                    if (bVar3 != 0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar11->iLineNumber);
                    }
                    for (; uVar6 = (ulong)*pbVar15, uVar6 < 0x21; pbVar15 = pbVar15 + 1) {
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar14 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar15,(float *)(pCVar10 + -1),true);
                        uVar6 = (ulong)*pbVar14, uVar6 < 0x21; pbVar14 = pbVar14 + 1) {
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar14 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar14,
                                                      &pCVar10[-1].super_BaseFrameDesc.vPositionXYZ.
                                                       y,true); uVar6 = (ulong)*pbVar14,
                        uVar6 < 0x21; pbVar14 = pbVar14 + 1) {
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                        }
                        break;
                      }
                    }
                    pbVar14 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar14,
                                                 &pCVar10[-1].super_BaseFrameDesc.vPositionXYZ.z,
                                                 true);
                    pbVar15 = pbVar14 + 2;
                    while( true ) {
                      bVar3 = *pbVar14;
                      uVar6 = (ulong)bVar3;
                      if (0x20 < uVar6) break;
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                          bVar3 = *pbVar14;
                        }
                        break;
                      }
                      pbVar14 = pbVar14 + 1;
                      pbVar15 = pbVar15 + 1;
                    }
                    if (bVar3 != 0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar11->iLineNumber);
                    }
                    while( true ) {
                      bVar3 = pbVar15[-1];
                      uVar6 = (ulong)bVar3;
                      if (0x20 < uVar6) break;
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                          bVar3 = pbVar15[-1];
                        }
                        break;
                      }
                      pbVar15 = pbVar15 + 1;
                    }
                    if (bVar3 != 0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar11->iLineNumber);
                    }
                    for (; uVar6 = (ulong)*pbVar15, uVar6 < 0x21; pbVar15 = pbVar15 + 1) {
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar14 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar15,
                                                      &pCVar10[-1].super_BaseFrameDesc.vRotationQuat
                                                       .x,true); uVar6 = (ulong)*pbVar14,
                        uVar6 < 0x21; pbVar14 = pbVar14 + 1) {
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pbVar14 = (byte *)fast_atoreal_move<float>
                                                     ((char *)pbVar14,
                                                      &pCVar10[-1].super_BaseFrameDesc.vRotationQuat
                                                       .y,true); uVar6 = (ulong)*pbVar14,
                        uVar6 < 0x21; pbVar14 = pbVar14 + 1) {
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                        }
                        break;
                      }
                    }
                    pbVar15 = (byte *)fast_atoreal_move<float>
                                                ((char *)pbVar14,
                                                 &pCVar10[-1].super_BaseFrameDesc.vRotationQuat.z,
                                                 true);
                    pbVar14 = pbVar15;
                    while( true ) {
                      pbVar15 = pbVar15 + 1;
                      bVar3 = *pbVar14;
                      uVar6 = (ulong)bVar3;
                      if (0x20 < uVar6) break;
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                          bVar3 = *pbVar14;
                        }
                        break;
                      }
                      pbVar14 = pbVar14 + 1;
                    }
                    if (bVar3 != 0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar11->iLineNumber);
                    }
                    for (; uVar6 = (ulong)*pbVar15, uVar6 < 0x21; pbVar15 = pbVar15 + 1) {
                      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
                        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar11->iLineNumber);
                        }
                        break;
                      }
                    }
                    local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ =
                         local_68.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
                    fast_atoreal_move<float>((char *)pbVar15,(float *)&local_68,true);
                    pCVar10[-1].fFOV = local_68.super_BaseFrameDesc.vPositionXYZ.x;
                    pEVar11 = pEVar11 + 1;
                  } while (pEVar11 != local_38);
                }
              }
            }
          }
        }
      }
      pSVar13 = local_48 + 1;
    } while (pSVar13 != local_40);
  }
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"MD5CameraParser end");
  return;
}

Assistant:

MD5CameraParser::MD5CameraParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5CameraParser begin");
    fFrameRate = 24.0f;

    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "numFrames")   {
            frames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "frameRate")  {
            fFrameRate = fast_atof ((*iter).mGlobalValue.c_str());
        }
        else if ((*iter).mName == "numCuts")    {
            cuts.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "cuts")   {
            for (const auto & elem : (*iter).mElements){
                cuts.push_back(strtoul10(elem.szStart)+1);
            }
        }
        else if ((*iter).mName == "camera") {
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                frames.push_back(CameraAnimFrameDesc());
                CameraAnimFrameDesc& cur = frames.back();
                AI_MD5_READ_TRIPLE(cur.vPositionXYZ);
                AI_MD5_READ_TRIPLE(cur.vRotationQuat);
                AI_MD5_SKIP_SPACES();
                cur.fFOV = fast_atof(sz);
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5CameraParser end");
}